

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LangevinPiston.cpp
# Opt level: O2

void __thiscall OpenMD::LangevinPiston::moveA(LangevinPiston *this)

{
  Thermo *this_00;
  RotationAlgorithm *pRVar1;
  Molecule *pMVar2;
  pointer pVVar3;
  Molecule *pMVar4;
  ulong uVar5;
  pointer ppSVar6;
  long lVar7;
  double dVar8;
  StuntDouble *pSVar9;
  long lVar10;
  RealType RVar11;
  MoleculeIterator i;
  Vector3d sc;
  Vector3d vel;
  Vector3d frc;
  Vector3d pos;
  Vector3d ji;
  Vector3d Tb;
  Vector3d COM;
  long local_188;
  MoleculeIterator local_180;
  Molecule *local_178;
  double local_170;
  ulong local_168;
  Molecule *local_160;
  double local_158;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  RectMatrix<double,_3U,_3U> local_78;
  
  local_180._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_120);
  Vector<double,_3U>::Vector(&local_c0);
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_138);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  this_00 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar11 = Thermo::getTemperature(this_00);
  (this->super_NPT).instaTemp = RVar11;
  Thermo::getPressureTensor((Mat3x3d *)&local_78,this_00);
  RectMatrix<double,_3U,_3U>::operator=
            ((RectMatrix<double,_3U,_3U> *)&(this->super_NPT).press,&local_78);
  (this->super_NPT).instaPress =
       (((this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[0][0] +
         (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
         data_[1][1] +
        (this->super_NPT).press.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_
        [2][2]) * 163882576.0) / 3.0;
  RVar11 = Thermo::getVolume(this_00);
  (this->super_NPT).instaVol = RVar11;
  Thermo::getCom((Vector3d *)&local_78,this_00);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])(this);
  pMVar4 = SimInfo::beginMolecule
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                      &local_180);
  while (pMVar4 != (Molecule *)0x0) {
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_178 = pMVar4;
    if (ppSVar6 !=
        (pMVar4->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_001e2b23;
    pSVar9 = (StuntDouble *)0x0;
    while (pSVar9 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_150,pSVar9);
      Vector<double,_3U>::operator=(&local_120,&local_150);
      StuntDouble::getFrc((Vector3d *)&local_150,pSVar9);
      Vector<double,_3U>::operator=(&local_d8,&local_150);
      local_170 = pSVar9->mass_;
      (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x10])
                (this,&local_138,&local_120);
      operator*(&local_108,
                ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 * 0.0004184)
                / local_170,&local_d8);
      operator*(&local_f0,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2,
                &local_138);
      operator-(&local_150,&local_108,&local_f0);
      Vector<double,_3U>::add(&local_120,&local_150);
      StuntDouble::setVel(pSVar9,(Vector3d *)&local_120);
      if (pSVar9->objType_ - otDAtom < 2) {
        StuntDouble::getTrq((Vector3d *)&local_108,pSVar9);
        StuntDouble::lab2Body((Vector3d *)&local_150,pSVar9,(Vector3d *)&local_108);
        Vector<double,_3U>::operator=(&local_90,&local_150);
        StuntDouble::getJ((Vector3d *)&local_150,pSVar9);
        Vector<double,_3U>::operator=(&local_a8,&local_150);
        operator*(&local_150,
                  (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 * 0.0004184,
                  &local_90);
        Vector<double,_3U>::add(&local_a8,&local_150);
        pRVar1 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rotAlgo_;
        (*pRVar1->_vptr_RotationAlgorithm[2])
                  ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt,pRVar1,
                   pSVar9,&local_a8);
        StuntDouble::setJ(pSVar9,(Vector3d *)&local_a8);
      }
      ppSVar6 = ppSVar6 + 1;
      pSVar9 = (StuntDouble *)0x0;
      if (ppSVar6 !=
          (local_178->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_001e2b23:
        pSVar9 = *ppSVar6;
      }
    }
    pMVar4 = SimInfo::nextMolecule
                       ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                        &local_180);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x15])(this);
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[4])();
  pMVar4 = SimInfo::beginMolecule
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                      &local_180);
  lVar7 = 0;
  while (pMVar4 != (Molecule *)0x0) {
    ppSVar6 = (pMVar4->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar6 ==
        (pMVar4->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar9 = (StuntDouble *)0x0;
    }
    else {
      pSVar9 = *ppSVar6;
    }
    lVar7 = (long)(int)lVar7;
    lVar10 = lVar7 * 0x18;
    while (ppSVar6 = ppSVar6 + 1, pSVar9 != (StuntDouble *)0x0) {
      StuntDouble::getPos((Vector3d *)&local_150,pSVar9);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)
                 ((long)(((this->super_NPT).oldPos.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar10),&local_150);
      if (ppSVar6 ==
          (pMVar4->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar9 = (StuntDouble *)0x0;
      }
      else {
        pSVar9 = *ppSVar6;
      }
      lVar10 = lVar10 + 0x18;
      lVar7 = lVar7 + 1;
    }
    pMVar4 = SimInfo::nextMolecule
                       ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                        &local_180);
  }
  uVar5 = 0;
  while ((int)uVar5 < (this->super_NPT).maxIterNum_) {
    local_168 = uVar5;
    pMVar4 = SimInfo::beginMolecule
                       ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                        &local_180);
    dVar8 = 0.0;
    while (pMVar4 != (Molecule *)0x0) {
      pMVar2 = (Molecule *)
               (pMVar4->integrableObjects_).
               super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (pMVar2 == (Molecule *)
                    (pMVar4->integrableObjects_).
                    super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        pSVar9 = (StuntDouble *)0x0;
      }
      else {
        pSVar9 = (StuntDouble *)pMVar2->_vptr_Molecule;
      }
      dVar8 = (double)(long)SUB84(dVar8,0);
      local_188 = (long)dVar8 * 0x18;
      local_160 = pMVar4;
      while (pSVar9 != (StuntDouble *)0x0) {
        local_178 = (Molecule *)&pMVar2->globalIndex_;
        StuntDouble::getVel((Vector3d *)&local_150,pSVar9);
        Vector<double,_3U>::operator=(&local_120,&local_150);
        StuntDouble::getPos((Vector3d *)&local_150,pSVar9);
        Vector<double,_3U>::operator=(&local_c0,&local_150);
        local_170 = dVar8;
        (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x12])
                  (this,&local_c0,&local_78,(ulong)dVar8 & 0xffffffff,&local_138);
        pVVar3 = (this->super_NPT).oldPos.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_158 = (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt;
        OpenMD::operator+(&local_f0,&local_120,&local_138);
        operator*(&local_108,local_158,&local_f0);
        OpenMD::operator+(&local_150,
                          (Vector<double,_3U> *)
                          ((long)(pVVar3->super_Vector<double,_3U>).data_ + local_188),&local_108);
        Vector3<double>::operator=((Vector3<double> *)&local_c0,&local_150);
        StuntDouble::setPos(pSVar9,(Vector3d *)&local_c0);
        if (local_178 ==
            (Molecule *)
            (local_160->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar9 = (StuntDouble *)0x0;
        }
        else {
          pSVar9 = (StuntDouble *)local_178->_vptr_Molecule;
        }
        local_188 = local_188 + 0x18;
        dVar8 = (double)((long)local_170 + 1);
        pMVar2 = local_178;
      }
      pMVar4 = SimInfo::nextMolecule
                         ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                          &local_180);
    }
    Rattle::constraintA((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_);
    uVar5 = (ulong)((int)local_168 + 1);
  }
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x17])(this);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void LangevinPiston::moveA() {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    Vector3d Tb, ji;
    RealType mass;
    Vector3d vel;
    Vector3d pos;
    Vector3d frc;
    Vector3d sc;
    int index;

    loadEta();

    instaTemp  = thermo.getTemperature();
    press      = thermo.getPressureTensor();
    instaPress = Constants::pressureConvert *
                 (press(0, 0) + press(1, 1) + press(2, 2)) / 3.0;
    instaVol = thermo.getVolume();

    Vector3d COM = thermo.getCom();

    // evolve velocity half step

    calcVelScale();

    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        vel = sd->getVel();
        frc = sd->getFrc();

        mass = sd->getMass();

        getVelScaleA(sc, vel);

        // velocity half step

        vel += dt2 * Constants::energyConvert / mass * frc - dt2 * sc;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          // get and convert the torque to body frame

          Tb = sd->lab2Body(sd->getTrq());

          // get the angular momentum, and propagate a half step

          ji = sd->getJ();

          ji += dt2 * Constants::energyConvert * Tb;

          rotAlgo_->rotate(sd, ji, dt);

          sd->setJ(ji);
        }
      }
    }
    // evolve eta a half step

    evolveEtaA();
    flucQ_->moveA();

    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldPos[index++] = sd->getPos();
      }
    }

    // the first estimation of r(t+dt) is equal to  r(t)

    for (int k = 0; k < maxIterNum_; k++) {
      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          vel = sd->getVel();
          pos = sd->getPos();

          this->getPosScale(pos, COM, index, sc);

          pos = oldPos[index] + dt * (vel + sc);
          sd->setPos(pos);

          ++index;
        }
      }

      rattle_->constraintA();
    }

    // Scale the box after all the positions have been moved:

    this->scaleSimBox();

    saveEta();
  }